

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ScaleLayerParams::SharedDtor(ScaleLayerParams *this)

{
  ScaleLayerParams *pSVar1;
  ScaleLayerParams *this_local;
  
  pSVar1 = internal_default_instance();
  if ((this != pSVar1) && (this->scale_ != (WeightParams *)0x0)) {
    (*(this->scale_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pSVar1 = internal_default_instance();
  if ((this != pSVar1) && (this->bias_ != (WeightParams *)0x0)) {
    (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void ScaleLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete scale_;
  }
  if (this != internal_default_instance()) {
    delete bias_;
  }
}